

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall
Memory::Recycler::FillCheckPad
          (Recycler *this,void *address,size_t size,size_t alignedAllocSize,
          bool objectAlreadyInitialized)

{
  size_t sVar1;
  size_t sVar2;
  
  if (this->verifyEnabled != false) {
    if (objectAlreadyInitialized) {
      sVar1 = alignedAllocSize - size;
      sVar2 = size;
    }
    else {
      sVar1 = alignedAllocSize - 8;
      if (*address != &PTR_Finalize_01362770) {
        sVar1 = alignedAllocSize;
      }
      sVar2 = (ulong)(*address == &PTR_Finalize_01362770) << 3;
    }
    VerifyCheckFill((void *)(sVar2 + (long)address),sVar1 - 8);
    if (8 < size && !objectAlreadyInitialized) {
      memset((void *)((long)address + 8),0,size - 8);
    }
    *(size_t *)((long)address + (alignedAllocSize - 8)) = alignedAllocSize - size;
  }
  return;
}

Assistant:

void
Recycler::FillCheckPad(void * address, size_t size, size_t alignedAllocSize, bool objectAlreadyInitialized)
{
    if (this->VerifyEnabled())
    {
        void* addressToVerify = address;
        size_t sizeToVerify = alignedAllocSize;

        if (objectAlreadyInitialized)
        {
            addressToVerify = ((char*) address + size);
            sizeToVerify = (alignedAllocSize - size);
        }
        else
        {
            // It could be the case that an uninitialized object already has a dummy vtable installed
            // at the beginning of the address. If that is the case, we can't verify the fill pattern
            // on that memory, since it's already been initialized.
            // Note that FillPadNoCheck will skip over the first sizeof(FreeObject) bytes, which
            // prevents overwriting of the vtable.
            static_assert(sizeof(DummyVTableObject) == sizeof(void*), "Incorrect size for a DummyVTableObject - it must contain a single v-table pointer");
            DummyVTableObject dummy;
            if ((*(void**)(&dummy)) == *((void**)address))
            {
                addressToVerify = (char*)address + sizeof(DummyVTableObject);
                sizeToVerify = alignedAllocSize - sizeof(DummyVTableObject);
            }
        }

        // Actually this is filling the non-pad to zero
        VerifyCheckFill(addressToVerify, sizeToVerify - sizeof(size_t));

        FillPadNoCheck(address, size, alignedAllocSize, objectAlreadyInitialized);
    }
}